

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosLog.h
# Opt level: O1

void adios2::helper::Throw<std::logic_error>
               (string *component,string *source,string *activity,string *message,int commRank)

{
  logic_error *this;
  string m;
  string local_30;
  
  MakeMessage(&local_30,component,source,activity,message,commRank,EXCEPTION);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,(string *)&local_30);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Throw(const std::string &component, const std::string &source, const std::string &activity,
           const std::string &message, const int commRank = -1)
{
    auto m = MakeMessage(component, source, activity, message, commRank, LogMode::EXCEPTION);
    throw(T(m));
}